

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O1

Result wabt::WriteBinarySpecScript
                 (Stream *json_stream,Script *script,string_view source_filename,
                 string_view module_filename_noext,WriteBinaryOptions *options,
                 vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
                 *out_module_streams,Stream *log_stream)

{
  Result RVar1;
  undefined1 local_110 [8];
  BinaryWriterSpec binary_writer_spec;
  _Any_data local_68;
  code *local_58;
  char *local_48;
  size_type sStack_40;
  Script *local_38;
  
  binary_writer_spec.num_modules_ = (size_t)&out_module_streams;
  local_38 = script;
  std::function<wabt::Stream_*(wabt::string_view)>::function
            ((function<wabt::Stream_*(wabt::string_view)> *)&local_68,
             (function<wabt::Stream_*(wabt::string_view)> *)&binary_writer_spec.num_modules_);
  local_48 = module_filename_noext.data_;
  sStack_40 = module_filename_noext.size_;
  anon_unknown_1::BinaryWriterSpec::BinaryWriterSpec
            ((BinaryWriterSpec *)local_110,json_stream,(WriteBinarySpecStreamFactory *)&local_68,
             source_filename,module_filename_noext,options);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  RVar1 = anon_unknown_1::BinaryWriterSpec::WriteScript((BinaryWriterSpec *)local_110,local_38);
  if ((size_type *)binary_writer_spec.source_filename_.field_2._8_8_ !=
      &binary_writer_spec.module_filename_noext_._M_string_length) {
    operator_delete((void *)binary_writer_spec.source_filename_.field_2._8_8_);
  }
  if (binary_writer_spec.module_stream_factory_._M_invoker !=
      (_Invoker_type)&binary_writer_spec.source_filename_._M_string_length) {
    operator_delete(binary_writer_spec.module_stream_factory_._M_invoker);
  }
  if (binary_writer_spec.module_stream_factory_.super__Function_base._M_functor._8_8_ != 0) {
    (*(code *)binary_writer_spec.module_stream_factory_.super__Function_base._M_functor._8_8_)
              (&binary_writer_spec.json_stream_,&binary_writer_spec.json_stream_,3);
  }
  std::
  _Function_handler<wabt::Stream_*(wabt::string_view),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-writer-spec.cc:533:7)>
  ::_M_manager((_Any_data *)&binary_writer_spec.num_modules_,
               (_Any_data *)&binary_writer_spec.num_modules_,__destroy_functor);
  return (Result)RVar1.enum_;
}

Assistant:

Result WriteBinarySpecScript(
    Stream* json_stream,
    Script* script,
    string_view source_filename,
    string_view module_filename_noext,
    const WriteBinaryOptions& options,
    std::vector<FilenameMemoryStreamPair>* out_module_streams,
    Stream* log_stream) {
  WriteBinarySpecStreamFactory module_stream_factory =
      [&](string_view filename) {
        out_module_streams->emplace_back(filename,
                                         MakeUnique<MemoryStream>(log_stream));
        return out_module_streams->back().stream.get();
      };

  BinaryWriterSpec binary_writer_spec(json_stream, module_stream_factory,
                                      source_filename, module_filename_noext,
                                      options);
  return binary_writer_spec.WriteScript(*script);
}